

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

void storeMapping(uint32_t codepoint,uint32_t *mapping,int32_t length,UStringPrepType type,
                 UErrorCode *status)

{
  FILE *__stream;
  UBool UVar1;
  short sVar2;
  uint32_t uVar3;
  void *pvVar4;
  undefined8 *value_00;
  char *pcVar5;
  int16_t delta;
  uint32_t savedTrieWord;
  ValueStruct *value;
  uint16_t trieWord;
  int16_t j;
  int16_t i;
  int16_t adjustedLen;
  UChar *map;
  UErrorCode *status_local;
  UStringPrepType type_local;
  int32_t length_local;
  uint32_t *mapping_local;
  uint32_t codepoint_local;
  
  value._6_2_ = 0;
  if (hashTable == (UHashtable *)0x0) {
    hashTable = uhash_open_63(hashEntry,compareEntries,(undefined1 *)0x0,status);
    uhash_setValueDeleter_63(hashTable,valueDeleter);
  }
  uVar3 = utrie_get32_63(sprepTrie,codepoint,(UBool *)0x0);
  if ((uVar3 != 0) && (uVar3 != 0xfff2)) {
    fprintf(_stderr,"Type for codepoint \\U%08X already set!.\n",(ulong)codepoint);
    exit(1);
  }
  for (value._4_2_ = 0; value._4_2_ < length; value._4_2_ = value._4_2_ + 1) {
    sVar2 = 2;
    if (mapping[value._4_2_] < 0x10000) {
      sVar2 = 1;
    }
    value._6_2_ = value._6_2_ + sVar2;
  }
  if (value._6_2_ == 0) {
    UVar1 = utrie_set32_63(sprepTrie,codepoint,0xfefc);
    if (UVar1 == '\0') {
      fprintf(_stderr,"Could not set the value for code point.\n");
      exit(1);
    }
  }
  else if ((((value._6_2_ == 1) && (sVar2 = (short)codepoint - (short)*mapping, -0x2001 < sVar2)) &&
           (sVar2 < 0x2000)) && ((ushort)(sVar2 * 4) < 0xfff0)) {
    UVar1 = utrie_set32_63(sprepTrie,codepoint,(uint)(ushort)(sVar2 * 4));
    if (UVar1 == '\0') {
      fprintf(_stderr,"Could not set the value for code point.\n");
      exit(1);
    }
  }
  else {
    pvVar4 = uprv_calloc_63((long)(value._6_2_ + 1),2);
    value._2_2_ = 0;
    for (value._4_2_ = 0; value._4_2_ < length; value._4_2_ = value._4_2_ + 1) {
      if (mapping[value._4_2_] < 0x10000) {
        *(short *)((long)pvVar4 + (long)value._2_2_ * 2) = (short)mapping[value._4_2_];
        value._2_2_ = value._2_2_ + 1;
      }
      else {
        sVar2 = value._2_2_ + 1;
        *(short *)((long)pvVar4 + (long)value._2_2_ * 2) =
             (short)(mapping[value._4_2_] >> 10) + -0x2840;
        value._2_2_ = value._2_2_ + 2;
        *(ushort *)((long)pvVar4 + (long)sVar2 * 2) = (ushort)mapping[value._4_2_] & 0x3ff | 0xdc00;
      }
    }
    value_00 = (undefined8 *)uprv_malloc_63(0x10);
    *value_00 = pvVar4;
    *(UStringPrepType *)((long)value_00 + 0xc) = type;
    *(short *)(value_00 + 1) = value._6_2_;
    if (3 < *(short *)(value_00 + 1)) {
      mappingDataCapacity = mappingDataCapacity + 1;
    }
    if (maxLength < *(short *)(value_00 + 1)) {
      maxLength = (int32_t)*(short *)(value_00 + 1);
    }
    uhash_iput_63(hashTable,codepoint,value_00,status);
    __stream = _stderr;
    mappingDataCapacity = value._6_2_ + mappingDataCapacity;
    if (U_ZERO_ERROR < *status) {
      pcVar5 = u_errorName_63(*status);
      fprintf(__stream,"Failed to put entries into the hastable. Error: %s\n",pcVar5);
      exit(*status);
    }
  }
  return;
}

Assistant:

extern void
storeMapping(uint32_t codepoint, uint32_t* mapping,int32_t length,
             UStringPrepType type, UErrorCode* status){
    
 
    UChar* map = NULL;
    int16_t adjustedLen=0, i, j;
    uint16_t trieWord = 0;
    ValueStruct *value = NULL;
    uint32_t savedTrieWord = 0;

    /* initialize the hashtable */
    if(hashTable==NULL){
        hashTable = uhash_open(hashEntry, compareEntries, NULL, status);
        uhash_setValueDeleter(hashTable, valueDeleter);
    }
    
    /* figure out if the code point has type already stored */
    savedTrieWord= utrie_get32(sprepTrie,codepoint,NULL);
    if(savedTrieWord!=0){
        if((savedTrieWord- _SPREP_TYPE_THRESHOLD) == USPREP_PROHIBITED){
            /* turn on the first bit in trie word */
            trieWord += 0x01;
        }else{
            /* 
             * the codepoint has value something other than prohibited
             * and a mapping .. error! 
             */
            fprintf(stderr,"Type for codepoint \\U%08X already set!.\n", (int)codepoint);
            exit(U_ILLEGAL_ARGUMENT_ERROR); 
        } 
    }

    /* figure out the real length */ 
    for(i=0; i<length; i++){
        adjustedLen += U16_LENGTH(mapping[i]);
    }

    if(adjustedLen == 0){
        trieWord = (uint16_t)(_SPREP_MAX_INDEX_VALUE << 2);
        /* make sure that the value of trieWord is less than the threshold */
        if(trieWord < _SPREP_TYPE_THRESHOLD){   
            /* now set the value in the trie */
            if(!utrie_set32(sprepTrie,codepoint,trieWord)){
                fprintf(stderr,"Could not set the value for code point.\n");
                exit(U_ILLEGAL_ARGUMENT_ERROR);   
            }
            /* value is set so just return */
            return;
        }else{
            fprintf(stderr,"trieWord cannot contain value greater than threshold 0x%04X.\n",_SPREP_TYPE_THRESHOLD);
            exit(U_ILLEGAL_CHAR_FOUND);
        }
    }

    if(adjustedLen == 1){
        /* calculate the delta */
        int16_t delta = (int16_t)((int32_t)codepoint - (int16_t) mapping[0]);
        if(delta >= SPREP_DELTA_RANGE_NEGATIVE_LIMIT && delta <= SPREP_DELTA_RANGE_POSITIVE_LIMIT){

            trieWord = delta << 2;


            /* make sure that the second bit is OFF */
            if((trieWord & 0x02) != 0 ){
                fprintf(stderr,"The second bit in the trie word is not zero while storing a delta.\n");
                exit(U_INTERNAL_PROGRAM_ERROR);
            }
            /* make sure that the value of trieWord is less than the threshold */
            if(trieWord < _SPREP_TYPE_THRESHOLD){   
                /* now set the value in the trie */
                if(!utrie_set32(sprepTrie,codepoint,trieWord)){
                    fprintf(stderr,"Could not set the value for code point.\n");
                    exit(U_ILLEGAL_ARGUMENT_ERROR);   
                }
                /* value is set so just return */
                return;
            }
        }
        /* 
         * if the delta is not in the given range or if the trieWord is larger than the threshold
         * just fall through for storing the mapping in the mapping table
         */
    }

    map = (UChar*) uprv_calloc(adjustedLen + 1, U_SIZEOF_UCHAR);
    
    for (i=0, j=0; i<length; i++) {
        U16_APPEND_UNSAFE(map, j, mapping[i]);
    }
    
    value = (ValueStruct*) uprv_malloc(sizeof(ValueStruct));
    value->mapping = map;
    value->type    = type;
    value->length  = adjustedLen;
    if(value->length > _SPREP_MAX_INDEX_TOP_LENGTH){
        mappingDataCapacity++;
    }
    if(maxLength < value->length){
        maxLength = value->length;
    }
    uhash_iput(hashTable,codepoint,value,status);
    mappingDataCapacity += adjustedLen;

    if(U_FAILURE(*status)){
        fprintf(stderr, "Failed to put entries into the hastable. Error: %s\n", u_errorName(*status));
        exit(*status);
    }
}